

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O0

void __thiscall
Centaurus::ATNNode<unsigned_char>::parse(ATNNode<unsigned_char> *this,Stream *stream)

{
  bool bVar1;
  wchar_t wVar2;
  StreamException *pSVar3;
  int local_30;
  int id;
  wchar_t local_1c;
  wchar_t ch;
  Stream *stream_local;
  ATNNode<unsigned_char> *this_local;
  
  wVar2 = Stream::peek(stream);
  bVar1 = Identifier::is_symbol_leader(wVar2);
  if (bVar1) {
    Identifier::parse(&this->m_invoke,stream);
    this->m_type = Nonterminal;
  }
  else if (wVar2 == L'/') {
    Stream::discard(stream);
    NFA<unsigned_char>::parse(&this->m_nfa,stream);
    this->m_type = RegularTerminal;
  }
  else {
    if ((wVar2 != L'\'') && (wVar2 != L'\"')) {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar3,stream,wVar2);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    parse_literal(this,stream);
    this->m_type = LiteralTerminal;
  }
  wVar2 = Stream::skip_whitespace(stream);
  if (wVar2 == L'{') {
    Stream::discard(stream);
    local_1c = Stream::skip_whitespace(stream);
    if (local_1c == L'}') {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar3,stream,L'}');
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    local_30 = 0;
    while (L'/' < local_1c && local_1c < L':') {
      local_30 = local_30 * 10 + local_1c + L'\xffffffd0';
      Stream::discard(stream);
      local_1c = Stream::peek(stream);
    }
    wVar2 = Stream::skip_whitespace(stream);
    if (wVar2 != L'}') {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar3,stream,wVar2);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    Stream::discard(stream);
    Stream::skip_whitespace(stream);
    this->m_localid = local_30;
  }
  return;
}

Assistant:

void ATNNode<TCHAR>::parse(Stream& stream)
{
    wchar_t ch = stream.peek();

    if (Identifier::is_symbol_leader(ch))
    {
        m_invoke.parse(stream);
        m_type = ATNNodeType::Nonterminal;
    }
    else if (ch == L'/')
    {
        stream.discard();
        m_nfa.parse(stream);
        m_type = ATNNodeType::RegularTerminal;
    }
    else if (ch == L'\'' || ch == L'"')
    {
        parse_literal(stream);
        m_type = ATNNodeType::LiteralTerminal;
    }
    else
    {
        throw stream.unexpected(ch);
    }

    ch = stream.skip_whitespace();

    if (ch == L'{')
    {
		stream.discard();

        ch = stream.skip_whitespace();

        if (ch == L'}')
            throw stream.unexpected(ch);

        int id = 0;
        for (; L'0' <= ch && ch <= L'9'; ch = stream.peek())
        {
            id = id * 10 + static_cast<int>(ch - L'0');
            stream.discard();
        }
        
        ch = stream.skip_whitespace();
        if (ch != L'}')
            throw stream.unexpected(ch);
        stream.discard();

		stream.skip_whitespace();

        m_localid = id;
    }
}